

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::anon_unknown_0::PtrIStream::seekg(PtrIStream *this,uint64_t pos)

{
  InputExc *this_00;
  long in_RSI;
  long in_RDI;
  stringstream _iex_throw_s_1;
  char *newcurrent;
  stringstream _iex_throw_s;
  stringstream local_338 [16];
  ostream local_328 [376];
  ulong local_1b0;
  
  local_1b0 = *(long *)(in_RDI + 0x28) + in_RSI;
  if ((*(ulong *)(in_RDI + 0x28) <= local_1b0) && (local_1b0 <= *(ulong *)(in_RDI + 0x38))) {
    *(ulong *)(in_RDI + 0x30) = local_1b0;
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_338);
  std::operator<<(local_328,"Out of range seek requested\n");
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,local_338);
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

virtual void     seekg (uint64_t pos)
    {

        if (pos < 0)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "internal error: seek to " << pos << " requested");
        }

        const char* newcurrent = base + pos;

        if (newcurrent < base || newcurrent > end)
        {
            THROW (IEX_NAMESPACE::InputExc, "Out of range seek requested\n");
        }

        current = newcurrent;
    }